

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

void __thiscall
alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::
create_two_new_data_nodes
          (Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
           *this,data_node_type *old_node,model_node_type *parent,int duplication_factor,
          bool reuse_model,int start_bucketID)

{
  bool bVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int right;
  int pos;
  int iVar9;
  int *piVar10;
  double *pdVar11;
  data_node_type *left_leaf_00;
  data_node_type *right_leaf_00;
  byte bVar12;
  int in_ECX;
  long in_RDX;
  AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *in_RSI;
  Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true> *in_RDI;
  int in_R9D;
  int i_1;
  int i;
  data_node_type *right_leaf;
  data_node_type *left_leaf;
  int right_boundary;
  int appending_left_bucketID;
  bool append_mostly_left;
  int appending_right_bucketID;
  bool append_mostly_right;
  int mid_bucketID;
  int end_bucketID;
  int num_buckets;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  undefined1 in_stack_ffffffffffffff43;
  int in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4c;
  undefined1 in_stack_ffffffffffffff4d;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  int local_88;
  int local_84;
  int local_6c [2];
  bool bVar13;
  bool bVar14;
  undefined4 in_stack_ffffffffffffffa0;
  int local_58;
  int iVar15;
  bool compute_cost;
  int left;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar16;
  int iVar17;
  
  if (in_ECX < 1) {
    __assert_fail("duplication_factor >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                  ,0x69d,
                  "void alex::Alex<double, double>::create_two_new_data_nodes(data_node_type *, model_node_type *, int, bool, int) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                 );
  }
  bVar12 = (byte)in_ECX;
  iVar6 = 1 << (bVar12 & 0x1f);
  local_88 = in_R9D + iVar6 / 2;
  AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  ::is_append_mostly_right(in_RSI);
  iVar7 = LinearModel<double>::predict((LinearModel<double> *)(in_RDX + 0x10),in_RSI->max_key_);
  iVar17 = 0;
  piVar10 = std::max<int>((int *)&stack0xffffffffffffffc4,(int *)&stack0xffffffffffffffc0);
  iVar8 = *(int *)(in_RDX + 0x30) + -1;
  std::min<int>(piVar10,(int *)&stack0xffffffffffffffbc);
  bVar5 = AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
          ::is_append_mostly_left(in_RSI);
  uVar16 = CONCAT13(bVar5,(int3)in_stack_ffffffffffffffb8);
  right = LinearModel<double>::predict((LinearModel<double> *)(in_RDX + 0x10),in_RSI->min_key_);
  iVar15 = 0;
  piVar10 = std::max<int>((int *)&stack0xffffffffffffffb0,(int *)&stack0xffffffffffffffac);
  local_58 = *(int *)(in_RDX + 0x30) + -1;
  piVar10 = std::min<int>(piVar10,&local_58);
  left = *piVar10;
  register0x00001200 = ((double)local_88 - *(double *)(in_RDX + 0x18)) / *(double *)(in_RDX + 0x10);
  pos = AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
        ::lower_bound<double>
                  ((AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                    *)CONCAT17(in_stack_ffffffffffffff37,
                               CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
                   (double *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  while( true ) {
    bVar1 = false;
    if (pos < in_RSI->data_capacity_) {
      pdVar11 = AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                ::get_key(in_RSI,pos);
      bVar1 = false;
      if ((*pdVar11 != 1.79769313486232e+308) || (NAN(*pdVar11))) {
        pdVar11 = AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                  ::get_key(in_RSI,pos);
        iVar9 = LinearModel<double>::predict((LinearModel<double> *)(in_RDX + 0x10),*pdVar11);
        bVar1 = iVar9 < local_88;
      }
    }
    dVar2 = stack0xffffffffffffff98;
    compute_cost = SUB41((uint)iVar15 >> 0x18,0);
    if (!bVar1) break;
    local_6c[0] = AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                  ::get_next_filled_position
                            ((AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                              *)CONCAT17(in_stack_ffffffffffffff4f,
                                         CONCAT16(in_stack_ffffffffffffff4e,
                                                  CONCAT15(in_stack_ffffffffffffff4d,
                                                           CONCAT14(in_stack_ffffffffffffff4c,
                                                                    in_stack_ffffffffffffff48)))),
                             in_stack_ffffffffffffff44,(bool)in_stack_ffffffffffffff43);
    local_6c[0] = local_6c[0] + 1;
    piVar10 = std::min<int>(local_6c,&in_RSI->data_capacity_);
    pos = *piVar10;
  }
  bVar14 = SUB81((ulong)stack0xffffffffffffff98 >> 0x38,0);
  bVar4 = bVar14;
  bVar13 = SUB81((ulong)dVar2 >> 0x30,0);
  bVar3 = bVar13;
  bVar5 = SUB81((ulong)dVar2 >> 0x28,0);
  bVar1 = bVar5;
  unique0x10000473 = dVar2;
  left_leaf_00 = bulk_load_leaf_node_from_existing
                           ((Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                             *)CONCAT44(iVar7,iVar17),(data_node_type *)CONCAT44(iVar8,uVar16),left,
                            right,compute_cost,(FTNode *)CONCAT44(pos,in_stack_ffffffffffffffa0),
                            bVar4,bVar3,bVar1);
  dVar2 = stack0xffffffffffffff98;
  bVar14 = SUB81((ulong)stack0xffffffffffffff98 >> 0x38,0);
  bVar4 = bVar14;
  bVar13 = SUB81((ulong)dVar2 >> 0x30,0);
  bVar3 = bVar13;
  bVar5 = SUB81((ulong)dVar2 >> 0x28,0);
  bVar1 = bVar5;
  unique0x1000047b = dVar2;
  right_leaf_00 =
       bulk_load_leaf_node_from_existing
                 ((Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                   *)CONCAT44(iVar7,iVar17),(data_node_type *)CONCAT44(iVar8,uVar16),left,right,
                  compute_cost,(FTNode *)CONCAT44(pos,in_stack_ffffffffffffffa0),bVar4,bVar3,bVar1);
  (left_leaf_00->super_AlexNode<double,_double>).level_ = *(short *)(in_RDX + 10) + 1;
  (right_leaf_00->super_AlexNode<double,_double>).level_ = *(short *)(in_RDX + 10) + 1;
  (left_leaf_00->super_AlexNode<double,_double>).duplication_factor_ = bVar12 - 1;
  (right_leaf_00->super_AlexNode<double,_double>).duplication_factor_ = bVar12 - 1;
  for (local_84 = in_R9D; local_84 < local_88; local_84 = local_84 + 1) {
    *(data_node_type **)(*(long *)(in_RDX + 0x38) + (long)local_84 * 8) = left_leaf_00;
  }
  for (; local_88 < in_R9D + iVar6; local_88 = local_88 + 1) {
    *(data_node_type **)(*(long *)(in_RDX + 0x38) + (long)local_88 * 8) = right_leaf_00;
  }
  link_data_nodes(in_RDI,in_RSI,left_leaf_00,right_leaf_00);
  return;
}

Assistant:

void create_two_new_data_nodes(data_node_type* old_node,
                                 model_node_type* parent,
                                 int duplication_factor, bool reuse_model,
                                 int start_bucketID = 0) {
    assert(duplication_factor >= 1);
    int num_buckets = 1 << duplication_factor;
    int end_bucketID = start_bucketID + num_buckets;
    int mid_bucketID = start_bucketID + num_buckets / 2;

    bool append_mostly_right = old_node->is_append_mostly_right();
    int appending_right_bucketID = std::min<int>(
        std::max<int>(parent->model_.predict(old_node->max_key_), 0),
        parent->num_children_ - 1);
    bool append_mostly_left = old_node->is_append_mostly_left();
    int appending_left_bucketID = std::min<int>(
        std::max<int>(parent->model_.predict(old_node->min_key_), 0),
        parent->num_children_ - 1);

    int right_boundary = old_node->lower_bound(
        (mid_bucketID - parent->model_.b_) / parent->model_.a_);
    // Account for off-by-one errors due to floating-point precision issues.
    while (right_boundary < old_node->data_capacity_ &&
           old_node->get_key(right_boundary) != data_node_type::kEndSentinel_ &&
           parent->model_.predict(old_node->get_key(right_boundary)) <
               mid_bucketID) {
      right_boundary = std::min(
          old_node->get_next_filled_position(right_boundary, false) + 1,
          old_node->data_capacity_);
    }
    data_node_type* left_leaf = bulk_load_leaf_node_from_existing(
        old_node, 0, right_boundary, true, nullptr, reuse_model,
        append_mostly_right && start_bucketID <= appending_right_bucketID &&
            appending_right_bucketID < mid_bucketID,
        append_mostly_left && start_bucketID <= appending_left_bucketID &&
            appending_left_bucketID < mid_bucketID);
    data_node_type* right_leaf = bulk_load_leaf_node_from_existing(
        old_node, right_boundary, old_node->data_capacity_, true, nullptr,
        reuse_model,
        append_mostly_right && mid_bucketID <= appending_right_bucketID &&
            appending_right_bucketID < end_bucketID,
        append_mostly_left && mid_bucketID <= appending_left_bucketID &&
            appending_left_bucketID < end_bucketID);
    left_leaf->level_ = static_cast<short>(parent->level_ + 1);
    right_leaf->level_ = static_cast<short>(parent->level_ + 1);
    left_leaf->duplication_factor_ =
        static_cast<uint8_t>(duplication_factor - 1);
    right_leaf->duplication_factor_ =
        static_cast<uint8_t>(duplication_factor - 1);

    for (int i = start_bucketID; i < mid_bucketID; i++) {
      parent->children_[i] = left_leaf;
    }
    for (int i = mid_bucketID; i < end_bucketID; i++) {
      parent->children_[i] = right_leaf;
    }
    link_data_nodes(old_node, left_leaf, right_leaf);
  }